

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Station.cpp
# Opt level: O1

void __thiscall imrt::Station::clearIntensity(Station *this)

{
  int iVar1;
  uint uVar2;
  pair<int,_int> pVar3;
  long lVar4;
  
  iVar1 = Collimator::getXdim(this->collimator);
  if (0 < iVar1) {
    lVar4 = 0;
    do {
      pVar3 = Collimator::getActiveRange(this->collimator,(int)lVar4,this->angle);
      uVar2 = pVar3.first;
      if ((int)uVar2 <= pVar3.second && -1 < (int)uVar2) {
        memset((this->I).p[lVar4] + (uVar2 & 0x7fffffff),0,(ulong)(pVar3.second - uVar2) * 8 + 8);
      }
      lVar4 = lVar4 + 1;
      iVar1 = Collimator::getXdim(this->collimator);
    } while (lVar4 < iVar1);
  }
  return;
}

Assistant:

void Station::clearIntensity() {
    pair<int,int> aux;
    for (int i=0; i < collimator.getXdim(); i++) {
      aux = collimator.getActiveRange(i,angle);
      if (aux.first<0) continue;
      for (int j=aux.first; j<=aux.second; j++) I(i,j)=0;
    }
  }